

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int encoder_append_uint64_value(ndn_encoder_t *encoder,uint64_t value)

{
  int local_24;
  int i;
  uint64_t value_local;
  ndn_encoder_t *encoder_local;
  
  if (encoder->output_max_size < encoder->offset + 8) {
    encoder_local._4_4_ = -10;
  }
  else {
    for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
      encoder->output_value[encoder->offset + local_24] =
           (uint8_t)(value >> (('\a' - (char)local_24) * '\b' & 0x3fU));
    }
    encoder->offset = encoder->offset + 8;
    encoder_local._4_4_ = 0;
  }
  return encoder_local._4_4_;
}

Assistant:

static inline int
encoder_append_uint64_value(ndn_encoder_t* encoder, uint64_t value)
{
  if (encoder->offset + 8 > encoder->output_max_size)
    return NDN_OVERSIZE;
  for (int i = 0; i < 8; i++) {
    encoder->output_value[encoder->offset + i] = (value >> (8 * (7 - i))) & 0xFF;
  }
  encoder->offset += 8;
  return 0;
}